

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_hugehelp.c
# Opt level: O3

void showhelp(char *trigger,char *arg,char *endarg)

{
  _Bool _Var1;
  int iVar2;
  uint uVar3;
  uchar *buf;
  scan_ctx ctx;
  uchar *local_198;
  undefined8 local_190;
  undefined8 uStack_188;
  uchar *local_180;
  undefined8 uStack_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  code *pcStack_158;
  code *local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  scan_ctx local_128;
  
  inithelpscan(&local_128,trigger,arg,endarg);
  local_160 = 0;
  uStack_148 = 0;
  uStack_188 = 0;
  local_140 = 0;
  uStack_138 = 0;
  local_170 = 0;
  uStack_168 = 0;
  local_180 = (uchar *)0x0;
  uStack_178 = 0;
  local_130 = 0;
  pcStack_158 = zalloc_func;
  local_150 = zfree_func;
  local_190 = 0x130bf;
  local_198 = hugehelpgz + 10;
  iVar2 = inflateInit2_(&local_198,0xfffffff1,"1.2.11",0x70);
  if (iVar2 == 0) {
    buf = (uchar *)malloc(0x10000);
    if (buf != (uchar *)0x0) {
      while( true ) {
        uStack_178 = CONCAT44(uStack_178._4_4_,0x10000);
        local_180 = buf;
        uVar3 = inflate(&local_198,2);
        if (1 < uVar3) break;
        _Var1 = helpscan(buf,(ulong)(0x10000 - (int)uStack_178),&local_128);
        if ((uVar3 == 1) || (!_Var1)) break;
      }
      free(buf);
    }
    inflateEnd(&local_198);
  }
  return;
}

Assistant:

void showhelp(const char *trigger, const char *arg, const char *endarg)
{
  unsigned char *buf;
  int status;
  z_stream z;
  struct scan_ctx ctx;
  inithelpscan(&ctx, trigger, arg, endarg);

  /* Make sure no gzip options are set */
  if(hugehelpgz[3] & 0xfe)
    return;

  memset(&z, 0, sizeof(z_stream));
  z.zalloc = (alloc_func)zalloc_func;
  z.zfree = (free_func)zfree_func;
  z.avail_in = (uInt)(sizeof(hugehelpgz) - HEADERLEN);
  z.next_in = (z_const Bytef *)hugehelpgz + HEADERLEN;

  if(inflateInit2(&z, -MAX_WBITS) != Z_OK)
    return;

  buf = malloc(BUF_SIZE);
  if(buf) {
    while(1) {
      z.avail_out = BUF_SIZE;
      z.next_out = buf;
      status = inflate(&z, Z_SYNC_FLUSH);
      if(status == Z_OK || status == Z_STREAM_END) {
        size_t len = BUF_SIZE - z.avail_out;
        if(!helpscan(buf, len, &ctx))
          break;
        if(status == Z_STREAM_END)
          break;
      }
      else
        break;    /* error */
    }
    free(buf);
  }
  inflateEnd(&z);
}